

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O3

void __thiscall
IntrusiveList<SynSwitchCase>::push_back(IntrusiveList<SynSwitchCase> *this,SynSwitchCase *node)

{
  SynSwitchCase **ppSVar1;
  bool bVar2;
  
  if (node == (SynSwitchCase *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<SynSwitchCase>::push_back(T *) [T = SynSwitchCase]");
  }
  if ((node->super_SynBase).next == (SynBase *)0x0) {
    if ((node->super_SynBase).listed != true) {
      (node->super_SynBase).listed = true;
      bVar2 = this->head != (SynSwitchCase *)0x0;
      ppSVar1 = (SynSwitchCase **)&(this->tail->super_SynBase).next;
      if (!bVar2) {
        ppSVar1 = &this->tail;
      }
      *ppSVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,"void IntrusiveList<SynSwitchCase>::push_back(T *) [T = SynSwitchCase]");
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<SynSwitchCase>::push_back(T *) [T = SynSwitchCase]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}